

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr.cpp
# Opt level: O2

qsbr_epoch __thiscall
unodb::qsbr::change_epoch(qsbr *this,qsbr_epoch current_global_epoch,bool single_thread_mode)

{
  qsbr_epoch qVar1;
  bool bVar2;
  type word;
  __int_type_conflict _Var3;
  __int_type_conflict word_00;
  qsbr_epoch local_2a;
  qsbr_epoch local_29 [8];
  qsbr_epoch current_global_epoch_local;
  
  local_29[0].epoch_val = current_global_epoch.epoch_val;
  epoch_change_barrier_and_handle_orphans(this,single_thread_mode);
  word_00 = (this->state).super___atomic_base<unsigned_long>._M_i;
  do {
    qVar1 = qsbr_state::get_epoch(word_00);
    bVar2 = detail::qsbr_epoch::operator==(local_29,qVar1);
    if (!bVar2) {
      __assert_fail("current_global_epoch == qsbr_state::get_epoch(old_state)",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.cpp"
                    ,0x1f9,"detail::qsbr_epoch unodb::qsbr::change_epoch(detail::qsbr_epoch, bool)")
      ;
    }
    word = qsbr_state::inc_epoch_reset_previous(word_00);
    LOCK();
    _Var3 = (this->state).super___atomic_base<unsigned_long>._M_i;
    bVar2 = word_00 == _Var3;
    if (bVar2) {
      (this->state).super___atomic_base<unsigned_long>._M_i = word;
      _Var3 = word_00;
    }
    UNLOCK();
    word_00 = _Var3;
  } while (!bVar2);
  local_2a = detail::qsbr_epoch::advance(local_29,1);
  qVar1 = qsbr_state::get_epoch(word);
  bVar2 = detail::qsbr_epoch::operator==(&local_2a,qVar1);
  if (!bVar2) {
    __assert_fail("current_global_epoch.advance() == qsbr_state::get_epoch(new_state)",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.cpp"
                  ,0x200,"detail::qsbr_epoch unodb::qsbr::change_epoch(detail::qsbr_epoch, bool)");
  }
  (this->epoch_change_count).super___atomic_base<unsigned_long>._M_i =
       (this->epoch_change_count).super___atomic_base<unsigned_long>._M_i + 1;
  qVar1 = detail::qsbr_epoch::advance(local_29,1);
  return (qsbr_epoch)qVar1.epoch_val;
}

Assistant:

detail::qsbr_epoch qsbr::change_epoch(detail::qsbr_epoch current_global_epoch,
                                      bool single_thread_mode) noexcept {
  epoch_change_barrier_and_handle_orphans(single_thread_mode);

  auto old_state = state.load(std::memory_order_acquire);
  while (true) {
    UNODB_DETAIL_ASSERT(current_global_epoch ==
                        qsbr_state::get_epoch(old_state));

    const auto new_state = qsbr_state::inc_epoch_reset_previous(old_state);
    if (UNODB_DETAIL_LIKELY(state.compare_exchange_weak(
            old_state, new_state, std::memory_order_acq_rel,
            std::memory_order_acquire))) {
      UNODB_DETAIL_ASSERT(current_global_epoch.advance() ==
                          qsbr_state::get_epoch(new_state));

#ifdef UNODB_DETAIL_WITH_STATS
      bump_epoch_change_count();
#endif  // UNODB_DETAIL_WITH_STATS
      return current_global_epoch.advance();
    }

    // Nobody else can change epoch nor threads in the previous epoch, only
    // allowed failures are thread count change and spurious. The next loop
    // iteration will assert this.
  }
}